

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O0

void array_suite::test_one(void)

{
  iterator iVar1;
  iterator iVar2;
  undefined4 local_cc;
  undefined1 local_c8 [3];
  bool local_c5 [1];
  output_type expected [4];
  bool array [1];
  undefined1 local_b8 [8];
  oarchive ar;
  undefined1 local_20 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  trial::protocol::bintoken::oarchive::
  oarchive<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((oarchive *)local_b8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20)
  ;
  local_c5[0] = false;
  boost::archive::detail::interface_oarchive<trial::protocol::bintoken::oarchive>::operator<<
            ((interface_oarchive<trial::protocol::bintoken::oarchive> *)local_b8,&local_c5);
  local_cc = 0x93800192;
  iVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/oarchive_suite.cpp"
             ,0x136,"void array_suite::test_one()",iVar1._M_current,iVar2._M_current,&local_cc,
             local_c8);
  trial::protocol::bintoken::oarchive::~oarchive((oarchive *)local_b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  return;
}

Assistant:

void test_one()
{
    std::vector<output_type> result;
    format::oarchive ar(result);
    bool array[] = { false };
    ar << array;

    output_type expected[] = { token::code::begin_array,
                              0x01,
                              0x80,
                              token::code::end_array };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<output_type>());
}